

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6526Storage.hpp
# Opt level: O2

void __thiscall MOS::MOS6526::TODStorage<true>::write<0>(TODStorage<true> *this,uint8_t v)

{
  if ((this->super_TODBase).write_alarm == true) {
    *(uint8_t *)&this->alarm_ = v;
    return;
  }
  *(uint8_t *)&this->value_ = v;
  this->increment_mask_ = 0xffffffff;
  return;
}

Assistant:

void write(uint8_t v) {
			if constexpr (byte == 3) {
				return;
			}
			constexpr int shift = byte << 3;

			// Write to either the alarm or the current value as directed;
			// writing to any part of the current value other than the LSB
			// pauses incrementing until the LSB is written.
			const uint32_t mask = uint32_t(~(0xff << shift));
			if(write_alarm) {
				alarm_ = (alarm_ & mask) | uint32_t(v << shift);
			} else {
				value_ = (value_ & mask) | uint32_t(v << shift);
				increment_mask_ = (byte == 0) ? uint32_t(~0) : 0;
			}
		}